

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

UnblindParameter * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (UnblindParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_out_index,Privkey *blinding_key)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint index;
  pointer puVar5;
  size_t sVar6;
  CfdException *this_00;
  ulong uVar7;
  size_t sVar8;
  bool bVar9;
  ConfidentialTxOut tx_out;
  uint local_294;
  undefined1 local_290 [32];
  byte local_270;
  ByteData local_258;
  ByteData local_238;
  ByteData local_218;
  ConfidentialNonce local_1f8;
  ConfidentialValue local_1d0;
  Privkey *local_1a8;
  ConfidentialValue local_1a0;
  ConfidentialNonce local_178;
  ConfidentialAssetId local_150;
  ConfidentialTxOut local_128;
  
  local_294 = tx_out_index;
  local_1a8 = blinding_key;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)tx_out_index,0xb6b,"UnblindTxOut");
  ConfidentialTxOut::ConfidentialTxOut
            (&local_128,
             (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start + local_294);
  ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_290,&local_128.asset_);
  bVar9 = true;
  if (1 < local_270) {
    ConfidentialNonce::ConfidentialNonce(&local_178,&local_128.nonce_);
    if (1 < local_178.version_) {
      ConfidentialValue::ConfidentialValue(&local_1a0,&local_128.confidential_value_);
      if (local_1a0.version_ < 2) {
        bVar3 = false;
      }
      else {
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (uVar7 == 0) {
          puVar5 = (pointer)0x0;
        }
        else {
          if ((long)uVar7 < 0) {
            ::std::__throw_bad_alloc();
          }
          puVar5 = (pointer)operator_new(uVar7);
        }
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar5 + uVar7;
        sVar8 = (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = puVar5;
        if (sVar8 != 0) {
          local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar5;
          memmove(puVar5,local_128.range_proof_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar8);
        }
        local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5 + sVar8;
        sVar6 = ByteData::GetDataSize(&local_218);
        if (sVar6 != 0) {
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar7 = (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          if (uVar7 == 0) {
            puVar5 = (pointer)0x0;
          }
          else {
            if ((long)uVar7 < 0) {
              ::std::__throw_bad_alloc();
            }
            puVar5 = (pointer)operator_new(uVar7);
          }
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar5 + uVar7;
          sVar8 = (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = puVar5;
          if (sVar8 != 0) {
            local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar5;
            memmove(puVar5,local_128.surjection_proof_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,sVar8);
          }
          local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar5 + sVar8;
          sVar6 = ByteData::GetDataSize(&local_238);
          bVar9 = sVar6 == 0;
          bVar4 = true;
          bVar3 = true;
          bVar2 = true;
          goto LAB_003ade27;
        }
        bVar3 = true;
      }
      bVar2 = false;
      bVar4 = true;
      bVar9 = true;
      goto LAB_003ade27;
    }
  }
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
LAB_003ade27:
  if ((bVar2) &&
     (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_238.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((bVar3) &&
     (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_218.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar4) {
    local_1a0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0087cda8;
    if (local_1a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (1 < local_270) {
    local_178._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
    if (local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_290._0_8_ = &PTR__ConfidentialAssetId_0087ccc8;
  pvVar1 = (void *)CONCAT44(local_290._12_4_,local_290._8_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_290._24_8_ - (long)pvVar1);
  }
  if (!bVar9) {
    ConfidentialNonce::ConfidentialNonce(&local_1f8,&local_128.nonce_);
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar7 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar7 == 0) {
      puVar5 = (pointer)0x0;
    }
    else {
      if ((long)uVar7 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar5 = (pointer)operator_new(uVar7);
    }
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar5 + uVar7;
    sVar8 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    if (sVar8 != 0) {
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      memmove(puVar5,local_128.range_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar8);
    }
    local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + sVar8;
    ConfidentialValue::ConfidentialValue(&local_1d0,&local_128.confidential_value_);
    AbstractTxOut::GetLockingScript((Script *)local_290,&local_128.super_AbstractTxOut);
    ConfidentialAssetId::ConfidentialAssetId(&local_150,&local_128.asset_);
    CalculateUnblindData
              (__return_storage_ptr__,&local_1f8,local_1a8,&local_258,&local_1d0,(Script *)local_290
               ,&local_150);
    local_150._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
    if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    Script::~Script((Script *)local_290);
    local_1d0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0087cda8;
    if (local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_258.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_1f8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
    if (local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    index = local_294;
    local_290._0_8_ = &PTR__ConfidentialNonce_0087cc78;
    ByteData::ByteData((ByteData *)(local_290 + 8));
    local_270 = '\0';
    ByteData::ByteData((ByteData *)&local_1f8);
    ByteData::ByteData((ByteData *)&local_1d0);
    SetTxOutCommitment(this,index,&__return_storage_ptr__->asset,&__return_storage_ptr__->value,
                       (ConfidentialNonce *)local_290,(ByteData *)&local_1f8,(ByteData *)&local_1d0)
    ;
    if (local_1d0._vptr_ConfidentialValue != (_func_int **)0x0) {
      operator_delete(local_1d0._vptr_ConfidentialValue,
                      (long)local_1d0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1d0._vptr_ConfidentialValue);
    }
    if (local_1f8._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(local_1f8._vptr_ConfidentialNonce,
                      (long)local_1f8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1f8._vptr_ConfidentialNonce);
    }
    local_290._0_8_ = &PTR__ConfidentialNonce_0087cc78;
    pvVar1 = (void *)CONCAT44(local_290._12_4_,local_290._8_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,local_290._24_8_ - (long)pvVar1);
    }
    ConfidentialTxOut::~ConfidentialTxOut(&local_128);
    return __return_storage_ptr__;
  }
  local_290._0_8_ = "cfdcore_elements_transaction.cpp";
  local_290._8_4_ = 0xb73;
  local_290._16_8_ = (long)"CfdUnblindTxOut" + 3;
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_290,kCfdLogLevelWarning,
             "Failed to unblind TxOut. Target TxOut already unblinded.: tx_out_index=[{}]",
             &local_294);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_290._0_8_ = local_290 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,"Failed to unblind TxOut. Target TxOut already unblinded.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_290);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::UnblindTxOut(
    uint32_t tx_out_index, const Privkey &blinding_key) {
  CheckTxOutIndex(tx_out_index, __LINE__, __FUNCTION__);

  ConfidentialTxOut tx_out(vout_[tx_out_index]);
  if (!tx_out.GetAsset().HasBlinding() || !tx_out.GetNonce().HasBlinding() ||
      !tx_out.GetConfidentialValue().HasBlinding() ||
      (tx_out.GetRangeProof().GetDataSize() == 0) ||
      (tx_out.GetSurjectionProof().GetDataSize() == 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxOut. Target TxOut already unblinded.: "
        "tx_out_index=[{}]",
        tx_out_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxOut. Target TxOut already unblinded.");
  }

  UnblindParameter result = CalculateUnblindData(
      tx_out.GetNonce(), blinding_key, tx_out.GetRangeProof(),
      tx_out.GetConfidentialValue(), tx_out.GetLockingScript(),
      tx_out.GetAsset());

  // clear and set unblind value to txout
  SetTxOutCommitment(
      tx_out_index, result.asset, result.value, ConfidentialNonce(),
      ByteData(), ByteData());

  return result;
}